

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

void __thiscall
mocker::ir::FunctionModule::FunctionModule(FunctionModule *this,FunctionModule *param_1)

{
  size_t sVar1;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->args,&param_1->args);
  std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::list
            (&this->bbs,&param_1->bbs);
  this->isExternal = param_1->isExternal;
  sVar1 = param_1->tempRegCounter;
  this->bbsSz = param_1->bbsSz;
  this->tempRegCounter = sVar1;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->bbMap)._M_h,&(param_1->bbMap)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->predecessors)._M_h,&(param_1->predecessors)._M_h);
  return;
}

Assistant:

FunctionModule(const FunctionModule &) = default;